

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O2

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint _h;
  size_t sVar2;
  Allocator *pAVar3;
  int *piVar4;
  undefined8 uVar5;
  void *pvVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int k;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int i;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  void *pvVar20;
  int j;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  float fVar26;
  Mat square_sum;
  Option opt_b;
  Mat square_blob;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar22 = bottom_top_blob->w;
  _h = bottom_top_blob->h;
  uVar23 = bottom_top_blob->c;
  sVar2 = bottom_top_blob->elemsize;
  square_blob.elemsize._0_4_ = 0;
  square_blob.elemsize._4_4_ = 0;
  square_blob.elempack = 0;
  square_blob.data = (void *)0x0;
  square_blob.refcount._0_4_ = 0;
  square_blob.refcount._4_4_ = 0;
  square_blob.allocator = (Allocator *)0x0;
  square_blob.dims = 0;
  square_blob.w = 0;
  square_blob.h = 0;
  square_blob.c = 0;
  square_blob.cstep = 0;
  Mat::create(&square_blob,uVar22,_h,uVar23,sVar2,opt->workspace_allocator);
  iVar11 = -100;
  if ((square_blob.data == (void *)0x0) || ((long)square_blob.c * square_blob.cstep == 0))
  goto LAB_00129393;
  uVar24 = 0;
  uVar25 = (ulong)(_h * uVar22);
  if ((int)(_h * uVar22) < 1) {
    uVar25 = uVar24;
  }
  uVar8 = 0;
  if (0 < (int)uVar23) {
    uVar8 = (ulong)uVar23;
  }
  for (; uVar24 != uVar8; uVar24 = uVar24 + 1) {
    Mat::channel(&square_sum,bottom_top_blob,(int)uVar24);
    pvVar20 = square_sum.data;
    Mat::~Mat(&square_sum);
    sVar7 = square_blob.cstep;
    pvVar6 = square_blob.data;
    lVar10 = CONCAT44(square_blob.elemsize._4_4_,(undefined4)square_blob.elemsize);
    square_sum.data = (void *)(square_blob.cstep * uVar24 * lVar10 + (long)square_blob.data);
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = (undefined4)square_blob.elemsize;
    square_sum.elemsize._4_4_ = square_blob.elemsize._4_4_;
    square_sum.elempack = square_blob.elempack;
    square_sum.allocator = square_blob.allocator;
    square_sum.w = square_blob.w;
    square_sum.dims = 2;
    square_sum.c = 1;
    square_sum.h = square_blob.h;
    square_sum.cstep = (size_t)(square_blob.h * square_blob.w);
    Mat::~Mat(&square_sum);
    for (uVar9 = 0; uVar25 != uVar9; uVar9 = uVar9 + 1) {
      fVar1 = *(float *)((long)pvVar20 + uVar9 * 4);
      *(float *)((long)pvVar6 + uVar9 * 4 + sVar7 * lVar10 * uVar24) = fVar1 * fVar1;
    }
  }
  if (this->region_type == 0) {
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.elempack = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.allocator = (Allocator *)0x0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.c = 0;
    square_sum.cstep = 0;
    Mat::create(&square_sum,uVar22,_h,uVar23,sVar2,opt->workspace_allocator);
    if ((square_sum.data == (void *)0x0) || ((long)square_sum.c * square_sum.cstep == 0)) {
LAB_00129385:
      Mat::~Mat(&square_sum);
      iVar11 = -100;
      goto LAB_00129393;
    }
    Mat::fill(&square_sum,0.0);
    iVar11 = this->local_size;
    fVar1 = this->alpha;
    for (uVar24 = 0; sVar2 = square_sum.cstep, pvVar20 = square_sum.data, uVar24 != uVar8;
        uVar24 = uVar24 + 1) {
      pAVar3 = (Allocator *)CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize);
      opt_b._0_8_ = square_sum.cstep * uVar24 * (long)pAVar3 + (long)square_sum.data;
      opt_b.blob_allocator = (Allocator *)0x0;
      opt_b.use_winograd_convolution = (bool)(undefined1)square_sum.elempack;
      opt_b.use_sgemm_convolution = (bool)square_sum.elempack._1_1_;
      opt_b.use_int8_inference = (bool)square_sum.elempack._2_1_;
      opt_b.use_vulkan_compute = (bool)square_sum.elempack._3_1_;
      opt_b._32_8_ = square_sum.allocator;
      opt_b.workspace_allocator = pAVar3;
      Mat::~Mat((Mat *)&opt_b);
      iVar14 = this->local_size;
      iVar15 = (int)uVar24;
      lVar10 = sVar2 * (long)pAVar3 * uVar24;
      for (uVar22 = iVar14 / -2 + iVar15; sVar2 = square_blob.cstep, pvVar6 = square_blob.data,
          (int)uVar22 <= iVar14 / 2 + iVar15; uVar22 = uVar22 + 1) {
        if ((int)uVar22 < (int)uVar23 && -1 < (int)uVar22) {
          pAVar3 = (Allocator *)
                   CONCAT44(square_blob.elemsize._4_4_,(undefined4)square_blob.elemsize);
          opt_b._0_8_ = square_blob.cstep * uVar22 * (long)pAVar3 + (long)square_blob.data;
          opt_b.blob_allocator = (Allocator *)0x0;
          opt_b.use_winograd_convolution = (bool)(undefined1)square_blob.elempack;
          opt_b.use_sgemm_convolution = (bool)square_blob.elempack._1_1_;
          opt_b.use_int8_inference = (bool)square_blob.elempack._2_1_;
          opt_b.use_vulkan_compute = (bool)square_blob.elempack._3_1_;
          opt_b._32_8_ = square_blob.allocator;
          opt_b.workspace_allocator = pAVar3;
          Mat::~Mat((Mat *)&opt_b);
          for (uVar9 = 0; uVar25 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)pvVar20 + uVar9 * 4 + lVar10) =
                 *(float *)((long)pvVar20 + uVar9 * 4 + lVar10) +
                 *(float *)((long)pvVar6 + uVar9 * 4 + sVar2 * (long)pAVar3 * (ulong)uVar22);
          }
          iVar14 = this->local_size;
        }
      }
      Mat::channel((Mat *)&opt_b,bottom_top_blob,iVar15);
      uVar5 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      for (uVar9 = 0; uVar25 != uVar9; uVar9 = uVar9 + 1) {
        fVar26 = powf(*(float *)((long)pvVar20 + uVar9 * 4 + lVar10) * fVar1 * (1.0 / (float)iVar11)
                      + this->bias,-this->beta);
        *(float *)(uVar5 + uVar9 * 4) = fVar26 * *(float *)(uVar5 + uVar9 * 4);
      }
    }
  }
  else {
    iVar11 = 0;
    if (this->region_type != 1) goto LAB_00129393;
    piVar4 = (int *)CONCAT44(square_blob.refcount._4_4_,square_blob.refcount._0_4_);
    square_sum.data = square_blob.data;
    square_sum.refcount._0_4_ = square_blob.refcount._0_4_;
    square_sum.refcount._4_4_ = square_blob.refcount._4_4_;
    square_sum.elemsize._0_4_ = (undefined4)square_blob.elemsize;
    square_sum.elemsize._4_4_ = square_blob.elemsize._4_4_;
    square_sum.elempack = square_blob.elempack;
    square_sum.allocator = square_blob.allocator;
    square_sum.dims = square_blob.dims;
    square_sum.w = square_blob.w;
    square_sum.h = square_blob.h;
    square_sum.c = square_blob.c;
    square_sum.cstep = square_blob.cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    uVar23 = this->local_size;
    uVar13 = uVar22;
    if (1 < (int)uVar23) {
      uVar13 = uVar23 >> 1;
      opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_b.use_packing_layout = opt->use_packing_layout;
      opt_b._34_6_ = *(undefined6 *)&opt->field_0x22;
      opt_b.lightmode = opt->lightmode;
      opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_b.num_threads = opt->num_threads;
      opt_b.workspace_allocator = opt->workspace_allocator;
      opt_b.use_winograd_convolution = opt->use_winograd_convolution;
      opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_b.use_int8_inference = opt->use_int8_inference;
      opt_b.use_vulkan_compute = opt->use_vulkan_compute;
      opt_b.use_fp16_packed = opt->use_fp16_packed;
      opt_b.use_fp16_storage = opt->use_fp16_storage;
      opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_b.use_int8_storage = opt->use_int8_storage;
      opt_b.blob_allocator = opt->workspace_allocator;
      copy_make_border(&square_blob,&square_sum,uVar13,~uVar13 + uVar23,uVar13,~uVar13 + uVar23,0,
                       0.0,&opt_b);
      if ((square_sum.data == (void *)0x0) || ((long)square_sum.c * square_sum.cstep == 0))
      goto LAB_00129385;
      uVar23 = this->local_size;
      uVar13 = square_sum.w;
    }
    uVar23 = uVar23 * uVar23;
    fVar1 = this->alpha;
    std::vector<int,_std::allocator<int>_>::vector
              (&_space_ofs,(ulong)uVar23,(allocator_type *)&opt_b);
    iVar11 = this->local_size;
    iVar15 = uVar13 - iVar11;
    lVar10 = 0;
    iVar14 = 0;
    for (iVar17 = 0; iVar17 < iVar11; iVar17 = iVar17 + 1) {
      for (lVar19 = 0; iVar18 = (int)lVar19, iVar18 < iVar11; lVar19 = lVar19 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar10 + lVar19] = iVar14 + iVar18;
        iVar11 = this->local_size;
      }
      iVar14 = iVar14 + iVar15 + iVar18;
      lVar10 = (int)lVar10 + lVar19;
    }
    uVar24 = 0;
    uVar25 = (ulong)uVar22;
    if ((int)uVar22 < 1) {
      uVar25 = uVar24;
    }
    uVar9 = (ulong)_h;
    if ((int)_h < 1) {
      uVar9 = uVar24;
    }
    for (; uVar24 != uVar8; uVar24 = uVar24 + 1) {
      Mat::channel((Mat *)&opt_b,bottom_top_blob,(int)uVar24);
      lVar10 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      opt_b.workspace_allocator =
           (Allocator *)CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize);
      pvVar20 = (void *)(square_sum.cstep * uVar24 * (long)opt_b.workspace_allocator +
                        (long)square_sum.data);
      opt_b.blob_allocator = (Allocator *)0x0;
      opt_b.use_winograd_convolution = (bool)(undefined1)square_sum.elempack;
      opt_b.use_sgemm_convolution = (bool)square_sum.elempack._1_1_;
      opt_b.use_int8_inference = (bool)square_sum.elempack._2_1_;
      opt_b.use_vulkan_compute = (bool)square_sum.elempack._3_1_;
      opt_b._32_8_ = square_sum.allocator;
      lVar19 = (long)opt_b.workspace_allocator * (long)square_sum.w;
      opt_b._0_8_ = pvVar20;
      for (uVar16 = 0; uVar16 != uVar9; uVar16 = uVar16 + 1) {
        for (uVar21 = 0; uVar21 != uVar25; uVar21 = uVar21 + 1) {
          fVar26 = 0.0;
          for (uVar12 = 0; uVar23 != uVar12; uVar12 = uVar12 + 1) {
            fVar26 = fVar26 + *(float *)((long)pvVar20 +
                                        (long)_space_ofs.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar12] * 4 +
                                        uVar21 * 4 + uVar16 * lVar19);
          }
          fVar26 = powf(fVar26 * fVar1 * (1.0 / (float)(int)uVar23) + this->bias,-this->beta);
          *(float *)(lVar10 + uVar21 * 4) = fVar26 * *(float *)(lVar10 + uVar21 * 4);
        }
        lVar10 = lVar10 + (long)(int)uVar22 * 4;
      }
      Mat::~Mat((Mat *)&opt_b);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  Mat::~Mat(&square_sum);
  iVar11 = 0;
LAB_00129393:
  Mat::~Mat(&square_blob);
  return iVar11;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p=q - local_size / 2; p<=q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i=0; i<size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i=0; i<size; i++)
            {
                ptr[i] = ptr[i] * pow(bias + alpha_div_size * ssptr[i], -beta);
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}